

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall
httplib::detail::SocketStream::get_local_ip_and_port(SocketStream *this,string *ip,int *port)

{
  size_type __len1;
  socklen_t __salen;
  int iVar1;
  size_t __len2;
  sockaddr_storage addr;
  array<char,_1025UL> ipstr;
  socklen_t local_4ac;
  sockaddr local_4a8 [8];
  char local_421 [1025];
  
  local_4ac = 0x80;
  iVar1 = getsockname(this->sock_,local_4a8,&local_4ac);
  __salen = local_4ac;
  if ((iVar1 == 0) && ((local_4a8[0].sa_family | 8) == 10)) {
    *port = (uint)(ushort)(local_4a8[0].sa_data._0_2_ << 8 | (ushort)local_4a8[0].sa_data._0_2_ >> 8
                          );
    memset(local_421,0,0x401);
    iVar1 = getnameinfo(local_4a8,__salen,local_421,0x401,(char *)0x0,0,1);
    if (iVar1 == 0) {
      __len1 = ip->_M_string_length;
      __len2 = strlen(local_421);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (ip,0,__len1,local_421,__len2);
    }
  }
  return;
}

Assistant:

inline void SocketStream::get_local_ip_and_port(std::string &ip,
                                                int &port) const {
  return detail::get_local_ip_and_port(sock_, ip, port);
}